

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# device.cpp
# Opt level: O1

int __thiscall Fossilize::Device::init(Device *this,EVP_PKEY_CTX *ctx)

{
  VkLayerInstanceDispatchTable *pVVar1;
  PFN_vkGetPhysicalDeviceProperties2 p_Var2;
  StateRecorder *pSVar3;
  Instance *in_RCX;
  VkDevice in_RDX;
  int *piVar4;
  int *in_R8;
  VkLayerDispatchTable *in_R9;
  VkPhysicalDeviceShaderModuleIdentifierPropertiesEXT identifierProps;
  VkPhysicalDeviceProperties2 props2;
  undefined4 local_398;
  undefined4 uStack_394;
  undefined4 uStack_390;
  undefined4 uStack_38c;
  undefined8 local_388;
  undefined8 uStack_380;
  VkPhysicalDeviceProperties2 local_378;
  
  this->gpu = (VkPhysicalDevice)ctx;
  this->device = in_RDX;
  this->pInstance = in_RCX;
  pVVar1 = in_RCX->pTable;
  this->pInstanceTable = pVVar1;
  this->pTable = in_R9;
  piVar4 = in_R8;
  if (in_R8 != (int *)0x0) {
    do {
      if (*piVar4 == 0x3ba1d6b0) break;
      piVar4 = *(int **)(piVar4 + 2);
    } while (piVar4 != (int *)0x0);
  }
  memset(&local_378,0,0x348);
  local_378.sType = VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_PROPERTIES_2;
  local_388 = 0;
  uStack_380 = 0;
  local_398 = 0x3ba1d6b1;
  uStack_394 = 0;
  uStack_390 = 0;
  uStack_38c = 0;
  if ((piVar4 == (int *)0x0) || (piVar4[4] == 0)) {
    (*pVVar1->GetPhysicalDeviceProperties)((VkPhysicalDevice)ctx,&local_378.properties);
  }
  else {
    p_Var2 = pVVar1->GetPhysicalDeviceProperties2;
    if ((p_Var2 == (PFN_vkGetPhysicalDeviceProperties2)0x0) &&
       (p_Var2 = pVVar1->GetPhysicalDeviceProperties2KHR,
       p_Var2 == (PFN_vkGetPhysicalDeviceProperties2)0x0)) {
      local_378.pNext = &local_398;
      (*pVVar1->GetPhysicalDeviceProperties)((VkPhysicalDevice)ctx,&local_378.properties);
    }
    else {
      local_378.pNext = &local_398;
      (*p_Var2)((VkPhysicalDevice)ctx,&local_378);
    }
    this->usesModuleIdentifiers = true;
  }
  pSVar3 = Instance::getStateRecorderForDevice
                     (this->pInstance,&local_378,this->pInstance->pAppInfo,in_R8);
  this->recorder = pSVar3;
  return (int)pSVar3;
}

Assistant:

void Device::init(VkPhysicalDevice gpu_, VkDevice device_, Instance *pInstance_,
                  const void *device_pnext,
                  VkLayerDispatchTable *pTable_)
{
	gpu = gpu_;
	device = device_;
	pInstance = pInstance_;
	pInstanceTable = pInstance->getTable();
	pTable = pTable_;

	// Need to know the UUID hash, so we can write module identifiers to appropriate path.
	auto *identifier =
			static_cast<const VkPhysicalDeviceShaderModuleIdentifierFeaturesEXT *>(
					findpNext(device_pnext,
					          VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_SHADER_MODULE_IDENTIFIER_FEATURES_EXT));

	VkPhysicalDeviceProperties2 props2 = { VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_PROPERTIES_2 };
	VkPhysicalDeviceShaderModuleIdentifierPropertiesEXT identifierProps =
			{ VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_SHADER_MODULE_IDENTIFIER_PROPERTIES_EXT };

	// Only bother if the application is actually using shader module identifiers.
	if (identifier && identifier->shaderModuleIdentifier)
	{
		props2.pNext = &identifierProps;
		if (pInstanceTable->GetPhysicalDeviceProperties2)
			pInstanceTable->GetPhysicalDeviceProperties2(gpu, &props2);
		else if (pInstanceTable->GetPhysicalDeviceProperties2KHR)
			pInstanceTable->GetPhysicalDeviceProperties2KHR(gpu, &props2);
		else
			pInstanceTable->GetPhysicalDeviceProperties(gpu, &props2.properties);

		usesModuleIdentifiers = true;
	}
	else
	{
		pInstanceTable->GetPhysicalDeviceProperties(gpu, &props2.properties);
	}

	recorder = pInstance->getStateRecorderForDevice(&props2, pInstance->getApplicationInfo(), device_pnext);
}